

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall capnp::compiler::NodeTranslator::compileStruct(NodeTranslator *this)

{
  ImplicitParams implicitMethodParams;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  undefined8 in_stack_00000048;
  undefined8 in_stack_00000050;
  undefined8 in_stack_00000058;
  undefined4 uVar1;
  BuilderFor<capnp::schema::Node::SourceInfo> local_1c0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  StructTranslator local_f8;
  NodeTranslator *local_18;
  NodeTranslator *this_local;
  
  local_18 = this;
  ImplicitParams::none();
  uVar1 = (undefined4)((ulong)uStack_108 >> 0x20);
  implicitMethodParams.params.reader.segment._0_4_ = (int)uStack_128;
  implicitMethodParams.scopeId = local_130;
  implicitMethodParams.params.reader.segment._4_4_ = (int)((ulong)uStack_128 >> 0x20);
  implicitMethodParams.params.reader.capTable._0_4_ = (int)local_120;
  implicitMethodParams.params.reader.capTable._4_4_ = (int)((ulong)local_120 >> 0x20);
  implicitMethodParams.params.reader.ptr._0_4_ = (int)uStack_118;
  implicitMethodParams.params.reader.ptr._4_4_ = (int)((ulong)uStack_118 >> 0x20);
  implicitMethodParams.params.reader.elementCount = (int)local_110;
  implicitMethodParams.params.reader.step = (int)((ulong)local_110 >> 0x20);
  implicitMethodParams.params.reader.structDataSize = (int)uStack_108;
  implicitMethodParams.params.reader.structPointerCount = (short)uVar1;
  implicitMethodParams.params.reader.elementSize = (char)((uint)uVar1 >> 0x10);
  implicitMethodParams.params.reader._39_1_ = (char)((uint)uVar1 >> 0x18);
  implicitMethodParams.params.reader._40_8_ = local_100;
  StructTranslator::StructTranslator(&local_f8,this,implicitMethodParams);
  local_168 = in_stack_00000008;
  uStack_160 = in_stack_00000010;
  local_158 = in_stack_00000018;
  uStack_150 = in_stack_00000020;
  local_148 = in_stack_00000028;
  uStack_140 = in_stack_00000030;
  local_178 = in_stack_00000058;
  local_198 = in_stack_00000038;
  uStack_190 = in_stack_00000040;
  local_188 = in_stack_00000048;
  uStack_180 = in_stack_00000050;
  Orphan<capnp::schema::Node::SourceInfo>::get(&local_1c0,&this->sourceInfo);
  StructTranslator::translate(&local_f8);
  StructTranslator::~StructTranslator(&local_f8);
  return;
}

Assistant:

void NodeTranslator::compileStruct(Void decl, List<Declaration>::Reader members,
                                   schema::Node::Builder builder) {
  StructTranslator(*this, ImplicitParams::none())
      .translate(decl, members, builder, sourceInfo.get());
}